

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmenu.cpp
# Opt level: O2

void QMenu::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QString *text;
  QIcon *this;
  QIconPrivate *pQVar1;
  QIconPrivate *pQVar2;
  QIconPrivate *pQVar3;
  bool bVar4;
  byte bVar5;
  undefined8 *puVar6;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  QIconPrivate *local_28;
  QWidgetData *local_18;
  
  local_18 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        aboutToShow((QMenu *)_o);
        return;
      }
      break;
    case 1:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        aboutToHide((QMenu *)_o);
        return;
      }
      break;
    case 2:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        triggered((QMenu *)_o,*_a[1]);
        return;
      }
      break;
    case 3:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        hovered((QMenu *)_o,*_a[1]);
        return;
      }
      break;
    case 4:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        internalDelayedPopup((QMenu *)_o);
        return;
      }
      break;
    case 5:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QMenuPrivate::_q_actionTriggered(*(QMenuPrivate **)(_o + 8));
        return;
      }
      break;
    case 6:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QMenuPrivate::_q_actionHovered(*(QMenuPrivate **)(_o + 8));
        return;
      }
      break;
    case 7:
      *(undefined8 *)(*(long *)(_o + 8) + 0x3a8) = *(undefined8 *)(*(long *)(_o + 8) + 0x3b0);
      goto switchD_00427554_caseD_3;
    case 8:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QMenuPrivate::_q_platformMenuAboutToShow(*(QMenuPrivate **)(_o + 8));
        return;
      }
      break;
    default:
      goto switchD_00427554_caseD_3;
    }
    goto LAB_0042790b;
  case ReadProperty:
    if (4 < (uint)_id) break;
    this = (QIcon *)*_a;
    switch(_id) {
    case 0:
      *(byte *)&this->d = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x420) >> 9) & 1;
      break;
    case 1:
      title((QString *)local_38,(QMenu *)_o);
      pQVar2 = this->d;
      pQVar3 = this[1].d;
      this->d = (QIconPrivate *)local_38._0_8_;
      this[1].d = (QIconPrivate *)local_38._8_8_;
      pQVar1 = this[2].d;
      this[2].d = local_28;
      local_38._0_8_ = pQVar2;
      local_38._8_8_ = pQVar3;
      local_28 = pQVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_38);
      break;
    case 2:
      icon((QMenu *)local_38);
      QIcon::operator=(this,(QIcon *)local_38);
      QIcon::~QIcon((QIcon *)local_38);
      break;
    case 3:
      bVar5 = *(byte *)(*(long *)(_o + 8) + 0x420) >> 3;
      goto LAB_0042779e;
    case 4:
      bVar5 = *(byte *)(*(long *)(_o + 8) + 0x420) >> 4;
LAB_0042779e:
      *(byte *)&this->d = bVar5 & 1;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      text = (QString *)*_a;
      switch(_id) {
      case 0:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setTearOffEnabled((QMenu *)_o,*(bool *)&(text->d).d);
          return;
        }
        break;
      case 1:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setTitle((QMenu *)_o,text);
          return;
        }
        break;
      case 2:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setIcon((QMenu *)_o,(QIcon *)text);
          return;
        }
        break;
      case 3:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setSeparatorsCollapsible((QMenu *)_o,*(bool *)&(text->d).d);
          return;
        }
        break;
      case 4:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setToolTipsVisible((QMenu *)_o,*(bool *)&(text->d).d);
          return;
        }
      }
      goto LAB_0042790b;
    }
    break;
  case IndexOfMethod:
    bVar4 = QtMocHelpers::indexOfMethod<void(QMenu::*)()>
                      ((QtMocHelpers *)_a,(void **)aboutToShow,0,0);
    if (((!bVar4) &&
        (bVar4 = QtMocHelpers::indexOfMethod<void(QMenu::*)()>
                           ((QtMocHelpers *)_a,(void **)aboutToHide,0,1), !bVar4)) &&
       (bVar4 = QtMocHelpers::indexOfMethod<void(QMenu::*)(QAction*)>
                          ((QtMocHelpers *)_a,(void **)triggered,0,2), !bVar4)) {
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QMenu::*)(QAction*)>
                  ((QtMocHelpers *)_a,(void **)hovered,0,3);
        return;
      }
      goto LAB_0042790b;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if ((_id == 2) || (_id == 3)) {
      puVar6 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
        break;
      }
    }
    else {
      puVar6 = (undefined8 *)*_a;
    }
    *puVar6 = 0;
  }
switchD_00427554_caseD_3:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0042790b:
  __stack_chk_fail();
}

Assistant:

void QMenu::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMenu *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->aboutToShow(); break;
        case 1: _t->aboutToHide(); break;
        case 2: _t->triggered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 3: _t->hovered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 4: _t->internalDelayedPopup(); break;
        case 5: _t->d_func()->_q_actionTriggered(); break;
        case 6: _t->d_func()->_q_actionHovered(); break;
        case 7: _t->d_func()->_q_overrideMenuActionDestroyed(); break;
        case 8: _t->d_func()->_q_platformMenuAboutToShow(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)()>(_a, &QMenu::aboutToShow, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)()>(_a, &QMenu::aboutToHide, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)(QAction * )>(_a, &QMenu::triggered, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)(QAction * )>(_a, &QMenu::hovered, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isTearOffEnabled(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->title(); break;
        case 2: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->separatorsCollapsible(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->toolTipsVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTearOffEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setTitle(*reinterpret_cast<QString*>(_v)); break;
        case 2: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 3: _t->setSeparatorsCollapsible(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setToolTipsVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}